

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
stringSliceLength(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  uint8_t *puVar2;
  unsigned_long uVar3;
  uint8_t h;
  ValueLength local_8;
  
  bVar1 = head((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x127598);
  if (bVar1 == 0xbf) {
    puVar2 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x1275b2);
    uVar3 = readIntegerFixed<unsigned_long,8ul>(puVar2 + 1);
    local_8 = uVar3 + 9;
  }
  else {
    local_8 = (ValueLength)(int)(bVar1 - 0x3f);
  }
  return local_8;
}

Assistant:

ValueLength stringSliceLength() const noexcept {
    // check if the type has a fixed length first
    auto const h = head();
    if (h == 0xbf) {
      // long UTF-8 String
      return static_cast<ValueLength>(
          1 + 8 + readIntegerFixed<ValueLength, 8>(start() + 1));
    }
    return static_cast<ValueLength>(1 + h - 0x40);
  }